

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O1

void dictionary_unset(dictionary *d,char *key)

{
  long lVar1;
  char **ppcVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  bool bVar7;
  
  if (d != (dictionary *)0x0 && key != (char *)0x0) {
    uVar4 = dictionary_hash(key);
    lVar1 = d->size;
    bVar3 = 0 < lVar1;
    if (0 < lVar1) {
      ppcVar2 = d->key;
      lVar6 = 1;
      do {
        if (((ppcVar2[lVar6 + -1] != (char *)0x0) && (uVar4 == d->hash[lVar6 + -1])) &&
           (iVar5 = strcmp(key,ppcVar2[lVar6 + -1]), iVar5 == 0)) {
          if (!bVar3) {
            return;
          }
          free(d->key[lVar6 + -1]);
          d->key[lVar6 + -1] = (char *)0x0;
          if (d->val[lVar6 + -1] != (char *)0x0) {
            free(d->val[lVar6 + -1]);
            d->val[lVar6 + -1] = (char *)0x0;
          }
          d->hash[lVar6 + -1] = 0;
          d->n = d->n + -1;
          return;
        }
        bVar3 = lVar6 < lVar1;
        bVar7 = lVar6 != lVar1;
        lVar6 = lVar6 + 1;
      } while (bVar7);
    }
  }
  return;
}

Assistant:

void dictionary_unset(dictionary * d, const char * key)
{
    unsigned    hash ;
    ssize_t      i ;

    if (key == NULL || d == NULL) {
        return;
    }

    hash = dictionary_hash(key);
    for (i = 0 ; i < d->size ; i++) {
        if (d->key[i] == NULL)
            continue ;
        /* Compare hash */
        if (hash == d->hash[i]) {
            /* Compare string, to avoid hash collisions */
            if (!strcmp(key, d->key[i])) {
                /* Found key */
                break ;
            }
        }
    }
    if (i >= d->size)
        /* Key not found */
        return ;

    free(d->key[i]);
    d->key[i] = NULL ;
    if (d->val[i] != NULL) {
        free(d->val[i]);
        d->val[i] = NULL ;
    }
    d->hash[i] = 0 ;
    d->n -- ;
    return ;
}